

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::multiset<long_long,std::less<long_long>,std::allocator<long_long>>>
               (multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_> *value,
               ostream *os)

{
  ostream *os_local;
  multiset<long_long,_std::less<long_long>,_std::allocator<long_long>_> *value_local;
  
  ContainerPrinter::
  PrintValue<std::multiset<long_long,std::less<long_long>,std::allocator<long_long>>,void>(value,os)
  ;
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}